

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsGetPropertyIdSymbolIterator(JsPropertyIdRef *propertyId)

{
  JsErrorCode JVar1;
  JsPropertyIdRef *local_10;
  JsPropertyIdRef *propertyId_local;
  
  local_10 = propertyId;
  JVar1 = ContextAPINoScriptWrapper_NoRecord<JsGetPropertyIdSymbolIterator::__0>
                    ((anon_class_8_1_66460f8e)&local_10,true,false);
  return JVar1;
}

Assistant:

CHAKRA_API
JsGetPropertyIdSymbolIterator(_Out_ JsPropertyIdRef * propertyId)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(propertyId);

        Js::PropertyId symbolIteratorPropertyId = scriptContext->GetLibrary()->GetPropertyIdSymbolIterator();
        *propertyId = Js::JavascriptNumber::ToVar(symbolIteratorPropertyId, scriptContext);

        return JsNoError;
    },
        /*allowInObjectBeforeCollectCallback*/true);
}